

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void storeRGBX32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QRgbaFloat32 *pQVar5;
  undefined1 auVar6 [16];
  QRgbaFloat32 QVar7;
  QRgbaFloat32 local_188;
  int local_16c;
  float local_108;
  float fStack_104;
  float fStack_100;
  __m128 vsr;
  float a;
  __m128 vsa;
  __m128 vsf;
  int i;
  __m128 zero;
  float fStack_20;
  float fStack_1c;
  QRgbaFloat32 *d;
  QDitherInfo *param_5_local;
  QList<unsigned_int> *param_4_local;
  
  auVar6 = insertps(ZEXT416(0),ZEXT416(0),0x10);
  auVar6 = insertps(auVar6,ZEXT416(0),0x20);
  QVar7 = (QRgbaFloat32)insertps(auVar6,ZEXT416(0x3f800000),0x30);
  for (local_16c = 0; local_16c < count; local_16c = local_16c + 1) {
    pQVar5 = src + local_16c;
    uVar1 = pQVar5->r;
    uVar2 = pQVar5->g;
    uVar3 = pQVar5->b;
    uVar4 = pQVar5->a;
    local_188 = *pQVar5;
    if ((((float)uVar4 != 1.0) || (NAN((float)uVar4))) &&
       (((float)uVar4 != 0.0 || (local_188 = QVar7, NAN((float)uVar4))))) {
      auVar6._4_4_ = uVar4;
      auVar6._0_4_ = uVar4;
      auVar6._8_4_ = uVar4;
      auVar6._12_4_ = uVar4;
      auVar6 = rcpps(auVar6,auVar6);
      zero[2] = auVar6._0_4_;
      zero[3] = auVar6._4_4_;
      fStack_20 = auVar6._8_4_;
      fStack_1c = auVar6._12_4_;
      local_188.g = (float)uVar2 * ((zero[3] + zero[3]) - zero[3] * zero[3] * (float)uVar4);
      local_188.r = (float)uVar1 * ((zero[2] + zero[2]) - zero[2] * zero[2] * (float)uVar4);
      local_188.b = (float)uVar3 * ((fStack_20 + fStack_20) - fStack_20 * fStack_20 * (float)uVar4);
      local_188.a = (float)uVar4 * ((fStack_1c + fStack_1c) - fStack_1c * fStack_1c * (float)uVar4);
      local_188 = (QRgbaFloat32)insertps((undefined1  [16])local_188,ZEXT416(0x3f800000),0x30);
    }
    *(undefined8 *)(dest + (long)local_16c * 0x10 + (long)index * 0x10) = local_188._0_8_;
    *(undefined8 *)(dest + (long)local_16c * 0x10 + (long)index * 0x10 + 8) = local_188._8_8_;
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBX32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set_ps(1.0f, 0.0f, 0.0f, 0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsf = _mm_mul_ps(vsf, vsr);
            vsf = _mm_insert_ps(vsf, _mm_set_ss(1.0f), 0x30);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}